

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guid_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::GUIDTest_test_new_guid_differ_Test::GUIDTest_test_new_guid_differ_Test
          (GUIDTest_test_new_guid_differ_Test *this)

{
  GUIDTest_test_new_guid_differ_Test *this_local;
  
  GUIDTest::GUIDTest(&this->super_GUIDTest);
  (this->super_GUIDTest).super_Test._vptr_Test =
       (_func_int **)&PTR__GUIDTest_test_new_guid_differ_Test_003de1a8;
  return;
}

Assistant:

TEST_F(GUIDTest, test_new_guid_differ)
{
    for (int it = 0; it < 1000; it++)
    {
        GUID guid0;
        GUID guid1;
        GUID guid2;
        GUID guid3;
        GUID guid4;
        GUID guid5;
        ASSERT_NE(guid0.ToString(), guid1.ToString());
        ASSERT_NE(guid0.ToString(), guid2.ToString());
        ASSERT_NE(guid0.ToString(), guid3.ToString());
        ASSERT_NE(guid0.ToString(), guid4.ToString());
        ASSERT_NE(guid0.ToString(), guid5.ToString());
    }
}